

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Parsing.c
# Opt level: O1

WJTL_STATUS TestDictionaries(_Bool IsJson5)

{
  WJTL_STATUS WVar1;
  WJTL_STATUS WVar2;
  WJTL_STATUS WVar3;
  WJTL_STATUS WVar4;
  WJTL_STATUS WVar5;
  WJTL_STATUS WVar6;
  WJTL_STATUS WVar7;
  WJTL_STATUS WVar8;
  WJTL_STATUS WVar9;
  WJTL_STATUS WVar10;
  WJTL_STATUS WVar11;
  WJTL_STATUS WVar12;
  WJTL_STATUS WVar13;
  WJTL_STATUS WVar14;
  WJTL_STATUS WVar15;
  WJTL_STATUS WVar16;
  WJTL_STATUS WVar17;
  WJTL_STATUS WVar18;
  WJTL_STATUS WVar19;
  WJTL_STATUS WVar20;
  WJTL_STATUS WVar21;
  WJTL_STATUS WVar22;
  WJTL_STATUS WVar23;
  size_t ErrorAtPos;
  undefined7 in_register_00000039;
  bool Condition;
  WJTL_STATUS local_60;
  size_t local_58;
  
  WVar1 = VerifyJsonParsesAsDictionaryOfNumbers(IsJson5,"{\"item1\":1,\"item2\":2,\"item3\":3 }",3);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \"{\\\"item1\\\":1,\\\"item2\\\":2,\\\"item3\\\":3 }\", 3 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x3d0);
  WVar2 = VerifyJsonParsesAsDictionaryOfNumbers(IsJson5,"{\"item3\":3,\"item2\":2,\"item1\":1 }",3);
  WjTestLib_Assert(WVar2 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \"{\\\"item3\\\":3,\\\"item2\\\":2,\\\"item1\\\":1 }\", 3 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x3d1);
  WVar3 = VerifyJsonParsesAsDictionaryOfNumbers(IsJson5," { \"item1\" : 1, \"item2\" : 2 }",2);
  WjTestLib_Assert(WVar3 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \" { \\\"item1\\\" : 1, \\\"item2\\\" : 2 }\", 2 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x3d2);
  WVar4 = VerifyJsonParsesAsDictionaryOfNumbers(IsJson5," { }",0);
  WjTestLib_Assert(WVar4 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \" { }\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x3d3);
  WVar5 = VerifyJsonParsesAsDictionaryOfStrings
                    (IsJson5,"{\"item1\":\"1\",\"item2\":\"2\",\"item3\":\"3\" }",3);
  WjTestLib_Assert(WVar5 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfStrings( IsJson5, \"{\\\"item1\\\":\\\"1\\\",\\\"item2\\\":\\\"2\\\",\\\"item3\\\":\\\"3\\\" }\", 3 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x3d6);
  WVar6 = VerifyJsonParsesAsDictionaryOfStrings
                    (IsJson5,"{\"item3\":\"3\",\"item2\":\"2\",\"item1\":\"1\" }",3);
  WjTestLib_Assert(WVar6 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfStrings( IsJson5, \"{\\\"item3\\\":\\\"3\\\",\\\"item2\\\":\\\"2\\\",\\\"item1\\\":\\\"1\\\" }\", 3 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x3d7);
  WVar7 = VerifyJsonParsesAsDictionaryOfStrings
                    (IsJson5," { \"item1\" : \"1\", \"item2\" : \"2\" }",2);
  WjTestLib_Assert(WVar7 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfStrings( IsJson5, \" { \\\"item1\\\" : \\\"1\\\", \\\"item2\\\" : \\\"2\\\" }\", 2 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x3d8);
  WVar8 = VerifyJsonParsesAsDictionaryOfStrings(IsJson5," { }",0);
  WjTestLib_Assert(WVar8 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfStrings( IsJson5, \" { }\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x3d9);
  WVar9 = VerifyJsonParsesAsDictionaryOfNumbers
                    (IsJson5,
                     " { \"dummy1\":\"String\", \"item1\" : 1, \"dummy2\":12345, \"item2\" : 2 }",2)
  ;
  WjTestLib_Assert(WVar9 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \" { \\\"dummy1\\\":\\\"String\\\", \\\"item1\\\" : 1, \\\"dummy2\\\":12345, \\\"item2\\\" : 2 }\", 2 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x3dc);
  WVar10 = VerifyJsonParsesAsDictionaryOfNumbers
                     (IsJson5,
                      " { \"dummy1\":{\"sub1\":true,\"sub2\":[{\"aa\":\"bb\"}, 1,2,3,4,5]}, \"item1\":1,  \"item2\":2 }"
                      ,2);
  WjTestLib_Assert(WVar10 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \" { \\\"dummy1\\\":{\\\"sub1\\\":true,\\\"sub2\\\":[{\\\"aa\\\":\\\"bb\\\"}, 1,2,3,4,5]}, \\\"item1\\\":1,  \\\"item2\\\":2 }\", 2 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x3dd);
  WVar23 = WJTL_STATUS_SUCCESS;
  if ((WVar10 != WJTL_STATUS_SUCCESS || WVar9 != WJTL_STATUS_SUCCESS) ||
      ((((WVar5 != WJTL_STATUS_SUCCESS || WVar6 != WJTL_STATUS_SUCCESS) ||
        WVar7 != WJTL_STATUS_SUCCESS) ||
       ((WVar3 != WJTL_STATUS_SUCCESS || WVar4 != WJTL_STATUS_SUCCESS) ||
       (WVar2 != WJTL_STATUS_SUCCESS || WVar1 != WJTL_STATUS_SUCCESS))) ||
      WVar8 != WJTL_STATUS_SUCCESS)) {
    WVar23 = WJTL_STATUS_FAILED;
  }
  WVar1 = WVar23;
  if ((int)CONCAT71(in_register_00000039,IsJson5) != 0) {
    WVar2 = VerifyJsonParsesAsDictionaryOfNumbers(true,"{\'item1\':1,\'item2\':2,\'item3\':3 }",3);
    WjTestLib_Assert(WVar2 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \"{\'item1\':1,\'item2\':2,\'item3\':3 }\", 3 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3e2);
    WVar3 = VerifyJsonParsesAsDictionaryOfNumbers(true,"{\'item3\':3,\'item2\':2,\'item1\':1 }",3);
    WjTestLib_Assert(WVar3 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \"{\'item3\':3,\'item2\':2,\'item1\':1 }\", 3 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3e3);
    WVar4 = VerifyJsonParsesAsDictionaryOfNumbers(true," { \'item1\' : 1, \'item2\' : 2 }",2);
    WjTestLib_Assert(WVar4 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \" { \'item1\' : 1, \'item2\' : 2 }\", 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3e4);
    WVar5 = VerifyJsonParsesAsDictionaryOfNumbers(true," { }",0);
    WjTestLib_Assert(WVar5 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \" { }\", 0 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3e5);
    WVar6 = VerifyJsonParsesAsDictionaryOfStrings
                      (true,"{\'item1\':\'1\',\'item2\':\'2\',\'item3\':\'3\' }",3);
    WjTestLib_Assert(WVar6 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfStrings( IsJson5, \"{\'item1\':\'1\',\'item2\':\'2\',\'item3\':\'3\' }\", 3 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",1000);
    WVar7 = VerifyJsonParsesAsDictionaryOfStrings
                      (true,"{\'item3\':\'3\',\'item2\':\'2\',\'item1\':\'1\' }",3);
    WjTestLib_Assert(WVar7 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfStrings( IsJson5, \"{\'item3\':\'3\',\'item2\':\'2\',\'item1\':\'1\' }\", 3 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3e9);
    WVar8 = VerifyJsonParsesAsDictionaryOfStrings
                      (true," { \'item1\' : \'1\', \'item2\' : \'2\' }",2);
    WjTestLib_Assert(WVar8 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfStrings( IsJson5, \" { \'item1\' : \'1\', \'item2\' : \'2\' }\", 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3ea);
    WVar9 = VerifyJsonParsesAsDictionaryOfStrings(true," { }",0);
    WjTestLib_Assert(WVar9 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfStrings( IsJson5, \" { }\", 0 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3eb);
    WVar10 = VerifyJsonParsesAsDictionaryOfNumbers
                       (true,
                        " { \'dummy1\':\'String\', \'item1\' : 1, \'dummy2\':12345, \'item2\' : 2 }"
                        ,2);
    WjTestLib_Assert(WVar10 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \" { \'dummy1\':\'String\', \'item1\' : 1, \'dummy2\':12345, \'item2\' : 2 }\", 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3ee);
    WVar11 = VerifyJsonParsesAsDictionaryOfNumbers
                       (true,
                        " { \'dummy1\':{\'sub1\':true,\'sub2\':[{\'aa\':\'bb\'}, 1,2,3,4,5]}, \'item1\':1,  \'item2\':2 }"
                        ,2);
    WjTestLib_Assert(WVar11 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \" { \'dummy1\':{\'sub1\':true,\'sub2\':[{\'aa\':\'bb\'}, 1,2,3,4,5]}, \'item1\':1,  \'item2\':2 }\", 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3ef);
    WVar12 = VerifyJsonParsesAsDictionaryOfNumbers(true,"{item1:1,item2:2,item3:3 }",3);
    WjTestLib_Assert(WVar12 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \"{item1:1,item2:2,item3:3 }\", 3 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3f2);
    WVar13 = VerifyJsonParsesAsDictionaryOfNumbers(true,"{item\\u0031:1,it\\u0065m2:2,item3:3 }",3);
    WjTestLib_Assert(WVar13 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \"{item\\\\u0031:1,it\\\\u0065m2:2,item3:3 }\", 3 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3f3);
    WVar14 = VerifyJsonParsesAsDictionaryOfNumbers(true,"{item3:3,item2:2,item1:1 }",3);
    WjTestLib_Assert(WVar14 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \"{item3:3,item2:2,item1:1 }\", 3 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3f4);
    WVar15 = VerifyJsonParsesAsDictionaryOfNumbers(true," { item1 : 1, item2 : 2 }",2);
    WjTestLib_Assert(WVar15 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \" { item1 : 1, item2 : 2 }\", 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3f5);
    WVar16 = VerifyJsonParsesAsDictionaryOfNumbers(true," { }",0);
    WjTestLib_Assert(WVar16 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \" { }\", 0 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3f6);
    WVar17 = VerifyJsonParsesAsDictionaryOfStrings(true,"{item1:\"1\",item2:\"2\",item3:\"3\" }",3);
    WjTestLib_Assert(WVar17 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfStrings( IsJson5, \"{item1:\\\"1\\\",item2:\\\"2\\\",item3:\\\"3\\\" }\", 3 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3f9);
    WVar18 = VerifyJsonParsesAsDictionaryOfStrings(true,"{item3:\"3\",item2:\"2\",item1:\"1\" }",3);
    WjTestLib_Assert(WVar18 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfStrings( IsJson5, \"{item3:\\\"3\\\",item2:\\\"2\\\",item1:\\\"1\\\" }\", 3 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3fa);
    WVar19 = VerifyJsonParsesAsDictionaryOfStrings(true," { item1 : \"1\", item2 : \"2\" }",2);
    WjTestLib_Assert(WVar19 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfStrings( IsJson5, \" { item1 : \\\"1\\\", item2 : \\\"2\\\" }\", 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3fb);
    WVar20 = VerifyJsonParsesAsDictionaryOfStrings(true," { }",0);
    WjTestLib_Assert(WVar20 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfStrings( IsJson5, \" { }\", 0 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3fc);
    WVar21 = VerifyJsonParsesAsDictionaryOfNumbers
                       (true," { dummy1:\"String\", item1 : 1, dummy2:12345, item2 : 2 }",2);
    WjTestLib_Assert(WVar21 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \" { dummy1:\\\"String\\\", item1 : 1, dummy2:12345, item2 : 2 }\", 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3ff);
    WVar22 = VerifyJsonParsesAsDictionaryOfNumbers
                       (true,
                        " { dummy1:{sub1:true,sub2:[{aa:\"bb\"}, 1,2,3,4,5]}, item1:1,  item2:2 }",2
                       );
    WjTestLib_Assert(WVar22 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \" { dummy1:{sub1:true,sub2:[{aa:\\\"bb\\\"}, 1,2,3,4,5]}, item1:1,  item2:2 }\", 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x400);
    WVar1 = WJTL_STATUS_FAILED;
    if (((((WVar20 == WJTL_STATUS_SUCCESS && WVar21 == WJTL_STATUS_SUCCESS) &&
          (WVar19 == WJTL_STATUS_SUCCESS && WVar18 == WJTL_STATUS_SUCCESS)) &&
         WVar22 == WJTL_STATUS_SUCCESS) &&
        ((((WVar14 == WJTL_STATUS_SUCCESS && WVar15 == WJTL_STATUS_SUCCESS) &&
          WVar16 == WJTL_STATUS_SUCCESS) &&
         ((WVar12 == WJTL_STATUS_SUCCESS && WVar13 == WJTL_STATUS_SUCCESS) &&
         (WVar11 == WJTL_STATUS_SUCCESS && WVar10 == WJTL_STATUS_SUCCESS))) &&
        WVar17 == WJTL_STATUS_SUCCESS)) &&
        ((((WVar6 == WJTL_STATUS_SUCCESS && WVar7 == WJTL_STATUS_SUCCESS) &&
          WVar8 == WJTL_STATUS_SUCCESS) &&
         ((WVar4 == WJTL_STATUS_SUCCESS && WVar5 == WJTL_STATUS_SUCCESS) &&
         (WVar3 == WJTL_STATUS_SUCCESS && WVar2 == WJTL_STATUS_SUCCESS))) &&
        WVar9 == WJTL_STATUS_SUCCESS)) {
      WVar1 = WVar23;
    }
  }
  if (IsJson5) {
    WVar2 = VerifyJsonParsesAsDictionaryOfNumbers(true,"{\"item1\":1, }",1);
    WjTestLib_Assert(WVar2 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \"{\\\"item1\\\":1, }\", 1 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x406);
    local_60 = VerifyJsonParsesAsDictionaryOfNumbers(true,"{\"item1\":1 , }",1);
    WjTestLib_Assert(local_60 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \"{\\\"item1\\\":1 , }\", 1 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x407);
    local_60 = local_60 | WVar2;
    ErrorAtPos = 0xb;
    local_58 = 0x12;
  }
  else {
    WVar2 = VerifyJsonUnableToParse(false,"{\"item1\":1, }",0xc);
    WjTestLib_Assert(WVar2 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"{\\\"item1\\\":1, }\", 12 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x40b);
    local_58 = 0xd;
    local_60 = VerifyJsonUnableToParse(false,"{\"item1\":1 , }",0xd);
    WjTestLib_Assert(local_60 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"{\\\"item1\\\":1 , }\", 13 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x40c);
    local_60 = local_60 | WVar2;
    ErrorAtPos = 2;
  }
  WVar2 = VerifyJsonUnableToParse(IsJson5,"{ \"item1\":1, \"item2\":2,, \"item3\":3 }",0x17);
  WjTestLib_Assert(WVar2 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"{ \\\"item1\\\":1, \\\"item2\\\":2,, \\\"item3\\\":3 }\", 23 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x410);
  WVar3 = VerifyJsonUnableToParse(IsJson5,"{ ,\"item1\":1, \"item2\":2, \"item3\":3 }",2);
  WjTestLib_Assert(WVar3 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"{ ,\\\"item1\\\":1, \\\"item2\\\":2, \\\"item3\\\":3 }\", 2 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x411);
  WVar4 = VerifyJsonUnableToParse(IsJson5,"{ BareWord }",ErrorAtPos);
  WjTestLib_Assert(WVar4 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"{ BareWord }\", IsJson5 ? 11 : 2 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x412);
  WVar5 = VerifyJsonUnableToParse(IsJson5,"{ \"string\" }",0xb);
  WjTestLib_Assert(WVar5 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"{ \\\"string\\\" }\", 11 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x413);
  WVar6 = VerifyJsonUnableToParse(IsJson5,"{ \'string\' }",ErrorAtPos);
  WjTestLib_Assert(WVar6 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"{ \'string\' }\", IsJson5 ? 11 : 2 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x414);
  WVar7 = VerifyJsonUnableToParse(IsJson5,"{ 123 }",2);
  WjTestLib_Assert(WVar7 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"{ 123 }\", 2 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x415);
  WVar8 = VerifyJsonUnableToParse(IsJson5,"{ [1,2,3] }",2);
  WjTestLib_Assert(WVar8 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"{ [1,2,3] }\", 2 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x416);
  WVar9 = VerifyJsonUnableToParse(IsJson5,"{ \"item1\":1, true }",local_58);
  WjTestLib_Assert(WVar9 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"{ \\\"item1\\\":1, true }\", IsJson5 ? 18 :13 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x417);
  WVar10 = VerifyJsonUnableToParse(IsJson5,"{ \"item1\":1, \"string\", \"item2\":2 }",0x15);
  WjTestLib_Assert(WVar10 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"{ \\\"item1\\\":1, \\\"string\\\", \\\"item2\\\":2 }\", 21 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x418);
  WVar23 = VerifyJsonUnableToParse(IsJson5,"{ \'key\" : \'value\' }",ErrorAtPos);
  WjTestLib_Assert(WVar23 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"{ \'key\\\" : \'value\' }\", IsJson5 ? 11 : 2 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x419);
  if (IsJson5) {
    WVar11 = VerifyJsonUnableToParse(true,"{ bare space: \"value\" }",7);
    Condition = WVar11 == WJTL_STATUS_SUCCESS;
    WjTestLib_Assert(Condition,
                     "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"{ bare space: \\\"value\\\" }\", 7 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x41d);
  }
  else {
    WVar11 = VerifyJsonUnableToParse(false,"{ \'key\' : \"value\" }",2);
    WjTestLib_Assert(WVar11 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"{ \'key\' : \\\"value\\\" }\", 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x421);
    WVar12 = VerifyJsonUnableToParse(false,"{ \"key\" : \'value\' }",10);
    WjTestLib_Assert(WVar12 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"{ \\\"key\\\" : \'value\' }\", 10 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x422);
    WVar13 = VerifyJsonUnableToParse(false,"{ \'key\' : \'value\' }",2);
    WjTestLib_Assert(WVar13 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"{ \'key\' : \'value\' }\", 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x423);
    Condition = (WVar12 == WJTL_STATUS_SUCCESS && WVar11 == WJTL_STATUS_SUCCESS) &&
                WVar13 == WJTL_STATUS_SUCCESS;
  }
  if (((((WVar6 != WJTL_STATUS_SUCCESS || WVar7 != WJTL_STATUS_SUCCESS) ||
        WVar8 != WJTL_STATUS_SUCCESS) || WVar9 != WJTL_STATUS_SUCCESS) ||
      (((WVar3 != WJTL_STATUS_SUCCESS || WVar4 != WJTL_STATUS_SUCCESS) ||
       WVar5 != WJTL_STATUS_SUCCESS) ||
      (WVar2 != WJTL_STATUS_SUCCESS || local_60 != WJTL_STATUS_SUCCESS))) ||
      (WVar23 != WJTL_STATUS_SUCCESS || WVar10 != WJTL_STATUS_SUCCESS)) {
    WVar1 = WJTL_STATUS_FAILED;
  }
  if (!Condition) {
    WVar1 = WJTL_STATUS_FAILED;
  }
  return WVar1;
}

Assistant:

static
WJTL_STATUS
    TestDictionaries
    (
        bool            IsJson5
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;

    // Test dictionary of numbers
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, "{\"item1\":1,\"item2\":2,\"item3\":3 }", 3 ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, "{\"item3\":3,\"item2\":2,\"item1\":1 }", 3 ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, " { \"item1\" : 1, \"item2\" : 2 }", 2 ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, " { }", 0 ) );

    // Test dictionary of strings
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfStrings( IsJson5, "{\"item1\":\"1\",\"item2\":\"2\",\"item3\":\"3\" }", 3 ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfStrings( IsJson5, "{\"item3\":\"3\",\"item2\":\"2\",\"item1\":\"1\" }", 3 ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfStrings( IsJson5, " { \"item1\" : \"1\", \"item2\" : \"2\" }", 2 ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfStrings( IsJson5, " { }", 0 ) );

    // Test dictionary of numbers that also contains other items we are ignoring (and ensuring get freed)
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, " { \"dummy1\":\"String\", \"item1\" : 1, \"dummy2\":12345, \"item2\" : 2 }", 2 ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, " { \"dummy1\":{\"sub1\":true,\"sub2\":[{\"aa\":\"bb\"}, 1,2,3,4,5]}, \"item1\":1,  \"item2\":2 }", 2 ) );

    if( IsJson5 )
    {
        // Test Json5 single quoted keys
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, "{'item1':1,'item2':2,'item3':3 }", 3 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, "{'item3':3,'item2':2,'item1':1 }", 3 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, " { 'item1' : 1, 'item2' : 2 }", 2 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, " { }", 0 ) );

        // Test dictionary of strings
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfStrings( IsJson5, "{'item1':'1','item2':'2','item3':'3' }", 3 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfStrings( IsJson5, "{'item3':'3','item2':'2','item1':'1' }", 3 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfStrings( IsJson5, " { 'item1' : '1', 'item2' : '2' }", 2 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfStrings( IsJson5, " { }", 0 ) );

        // Test dictionary of numbers that also contains other items we are ignoring (and ensuring get freed)
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, " { 'dummy1':'String', 'item1' : 1, 'dummy2':12345, 'item2' : 2 }", 2 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, " { 'dummy1':{'sub1':true,'sub2':[{'aa':'bb'}, 1,2,3,4,5]}, 'item1':1,  'item2':2 }", 2 ) );

        // Test Json5 bareword keys
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, "{item1:1,item2:2,item3:3 }", 3 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, "{item\\u0031:1,it\\u0065m2:2,item3:3 }", 3 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, "{item3:3,item2:2,item1:1 }", 3 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, " { item1 : 1, item2 : 2 }", 2 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, " { }", 0 ) );

        // Test dictionary of strings
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfStrings( IsJson5, "{item1:\"1\",item2:\"2\",item3:\"3\" }", 3 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfStrings( IsJson5, "{item3:\"3\",item2:\"2\",item1:\"1\" }", 3 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfStrings( IsJson5, " { item1 : \"1\", item2 : \"2\" }", 2 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfStrings( IsJson5, " { }", 0 ) );

        // Test dictionary of numbers that also contains other items we are ignoring (and ensuring get freed)
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, " { dummy1:\"String\", item1 : 1, dummy2:12345, item2 : 2 }", 2 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, " { dummy1:{sub1:true,sub2:[{aa:\"bb\"}, 1,2,3,4,5]}, item1:1,  item2:2 }", 2 ) );
    }

    // Test trailing commas for Json5
    if( IsJson5 )
    {
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, "{\"item1\":1, }", 1 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, "{\"item1\":1 , }", 1 ) );
    }
    else
    {
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "{\"item1\":1, }", 12 ) );
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "{\"item1\":1 , }", 13 ) );
    }

    // Test invalid dictionaries
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "{ \"item1\":1, \"item2\":2,, \"item3\":3 }", 23 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "{ ,\"item1\":1, \"item2\":2, \"item3\":3 }", 2 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "{ BareWord }", IsJson5 ? 11 : 2 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "{ \"string\" }", 11 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "{ 'string' }", IsJson5 ? 11 : 2 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "{ 123 }", 2 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "{ [1,2,3] }", 2 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "{ \"item1\":1, true }", IsJson5 ? 18 :13 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "{ \"item1\":1, \"string\", \"item2\":2 }", 21 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "{ 'key\" : 'value' }", IsJson5 ? 11 : 2 ) );

    if( IsJson5 )
    {
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "{ bare space: \"value\" }", 7 ) );
    }
    else
    {
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "{ 'key' : \"value\" }", 2 ) );
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "{ \"key\" : 'value' }", 10 ) );
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "{ 'key' : 'value' }", 2 ) );
    }

    return TestReturn;
}